

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

AActor * P_LineAttack(AActor *t1,DAngle *angle,double distance,DAngle *pitch,int damage,
                     FName *damageType,PClassActor *pufftype,int flags,FTranslatedLineTarget *victim
                     ,int *actualdamage)

{
  double dVar1;
  double dVar2;
  player_t *ppVar3;
  BYTE *pBVar4;
  AWeapon *pAVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int damage_00;
  bool bVar10;
  bool bVar11;
  int iVar12;
  uint uVar13;
  PClassActor *pPVar14;
  AActor *pAVar15;
  AActor *pAVar16;
  DWORD flags_00;
  byte bVar17;
  byte bVar18;
  uint flags_01;
  bool bVar19;
  uint local_214;
  Origin TData;
  DVector3 bleedpos;
  double local_1d0;
  DVector2 ofs;
  FName local_1a8;
  FName local_1a4;
  FSoundID local_1a0;
  ActorFlags local_19c;
  FTraceResults trace;
  DVector3 direction;
  DAngle local_b0;
  DAngle local_a8;
  DAngle local_a0;
  DAngle local_98;
  DAngle local_90;
  DAngle local_88;
  DAngle local_80;
  DAngle local_78;
  DAngle local_70;
  DAngle local_68;
  DAngle local_60;
  DAngle local_58;
  DAngle local_50;
  DAngle local_48;
  DAngle local_40;
  DAngle local_38;
  
  if (victim != (FTranslatedLineTarget *)0x0) {
    (victim->attackAngleFromSource).Degrees = 0.0;
    *(undefined8 *)&victim->unlinked = 0;
    victim->linetarget = (AActor *)0x0;
    (victim->angleFromSource).Degrees = 0.0;
  }
  if (actualdamage != (int *)0x0) {
    *actualdamage = 0;
  }
  TData.Caller = t1;
  dVar6 = FFastTrig::cos(&fasttrig,pitch->Degrees * 11930464.711111112 + 6755399441055744.0);
  dVar7 = FFastTrig::cos(&fasttrig,angle->Degrees * 11930464.711111112 + 6755399441055744.0);
  dVar8 = FFastTrig::sin(&fasttrig,angle->Degrees * 11930464.711111112 + 6755399441055744.0);
  dVar9 = FFastTrig::sin(&fasttrig,pitch->Degrees * 11930464.711111112 + 6755399441055744.0);
  direction.Z = -dVar9;
  dVar9 = t1->Height;
  dVar1 = (t1->__Pos).Z;
  ppVar3 = t1->player;
  if (ppVar3 == (player_t *)0x0) {
    bVar19 = true;
    local_214 = 2;
    local_1d0 = 8.0;
  }
  else {
    local_1d0 = ppVar3->mo->AttackZOffset * ppVar3->crouchfactor;
    if ((damageType->Index == 0xcd) || (damageType->Index == 0x89)) {
      local_214 = 0x22;
      bVar19 = false;
    }
    else {
      bVar19 = true;
      local_214 = 2;
    }
  }
  dVar2 = t1->Floorclip;
  direction.X = dVar7 * dVar6;
  direction.Y = dVar8 * dVar6;
  pPVar14 = PClassActor::GetReplacement(pufftype,true);
  pBVar4 = (pPVar14->super_PClass).Defaults;
  if (((t1->player == (player_t *)0x0) ||
      (pAVar5 = t1->player->ReadyWeapon, pAVar5 == (AWeapon *)0x0)) ||
     (TData.hitGhosts = true,
     ((pAVar5->super_AStateProvider).super_AInventory.super_AActor.flags2.Value & 0x4000) == 0)) {
    if (pBVar4 == (BYTE *)0x0) {
      TData.hitGhosts = false;
    }
    else {
      TData.hitGhosts = (bool)((byte)(*(uint *)(pBVar4 + 0x1c0) >> 0xe) & 1);
    }
  }
  if (pBVar4 == (BYTE *)0x0) {
    bVar18 = 0;
    TData.MThruSpecies = false;
  }
  else {
    bVar18 = (pBVar4[0x1c5] & 0x40) >> 6;
    TData.MThruSpecies = (bool)(pBVar4[0x1d0] >> 2 & 1);
  }
  TData.PuffSpecies.super_FName.Index = (FName)0;
  if ((pBVar4[0x1d6] & 0x40) == 0) {
    TData.ThruSpecies = false;
    TData.ThruActors = false;
  }
  else {
    if (pBVar4 == (BYTE *)0x0) {
      TData.ThruSpecies = false;
      TData.ThruActors = false;
    }
    else {
      TData.ThruSpecies = (bool)(pBVar4[0x1d0] >> 1 & 1);
      TData.ThruActors = (bool)((byte)(*(uint *)(pBVar4 + 0x1c0) >> 0x14) & 1);
    }
    trace.Sector = (sector_t *)(t1->__Pos).X;
    trace._8_8_ = (t1->__Pos).Y;
    trace.HitPos.X = (t1->__Pos).Z;
    pAVar15 = AActor::StaticSpawn(pufftype,(DVector3 *)&trace,ALLOW_REPLACE,false);
    if (pAVar15 != (AActor *)0x0) {
      AActor::GetSpecies((AActor *)&trace);
      TData.PuffSpecies.super_FName.Index = (FName)(FName)trace.Sector._0_4_;
      (*(pAVar15->super_DThinker).super_DObject._vptr_DObject[4])(pAVar15);
    }
  }
  iVar12 = damageType->Index;
  if ((iVar12 == 0) || (iVar12 == 0x89)) {
    if (pBVar4 != (BYTE *)0x0) goto LAB_004106ac;
  }
  else if (pBVar4 != (BYTE *)0x0 && iVar12 == 0xcd) {
LAB_004106ac:
    if (*(int *)(pBVar4 + 0x404) != 0) {
      damageType->Index = *(int *)(pBVar4 + 0x404);
    }
  }
  bleedpos.Z = ((dVar9 * 0.5 + dVar1) - dVar2) + local_1d0;
  flags_00 = 1;
  if (((flags & 8U) == 0) && ((pBVar4 == (BYTE *)0x0 || ((pBVar4[0x1d2] & 1) == 0)))) {
    flags_00 = 5;
  }
  flags_01 = (flags * 8 & 0x10U) + (flags & 1U) * 2;
  bleedpos.X = (t1->__Pos).X;
  bleedpos.Y = (t1->__Pos).Y;
  local_19c.Value = 4;
  bVar11 = Trace(&bleedpos,(sector_t_conflict *)t1->Sector,&direction,distance,&local_19c,0x8008000,
                 t1,&trace,flags_00,CheckForActor,&TData);
  if (!bVar11) {
    if (((flags & 8U) == 0 && pBVar4 != (BYTE *)0x0) && (*(int *)(pBVar4 + 0x3d4) != 0)) {
      local_1a0.ID = *(int *)(pBVar4 + 0x3d4);
      S_Sound(t1,1,&local_1a0,1.0,1.0);
    }
    if ((flags & 8U) == 0) {
      if (pBVar4 == (BYTE *)0x0) {
        return (AActor *)0x0;
      }
      if ((pBVar4[0x1c4] & 0x10) == 0) {
        return (AActor *)0x0;
      }
    }
    local_38.Degrees = trace.SrcAngleFromTarget.Degrees;
    local_40.Degrees = trace.SrcAngleFromTarget.Degrees;
    pAVar15 = P_SpawnPuff(t1,pufftype,&trace.HitPos,&local_38,&local_40,2,flags_01,(AActor *)0x0);
    if ((flags & 8U) != 0) {
      return pAVar15;
    }
    bVar11 = false;
    goto LAB_00410f8c;
  }
  if (trace.HitType == TRACE_HitActor) {
    bleedpos.X = trace.HitPos.X;
    bleedpos.Y = trace.HitPos.Y;
    bleedpos.Z = trace.HitPos.Z;
    if ((i_compatflags._3_1_ & 0x10) != 0) {
      P_GetOffsetPosition(trace.HitPos.X,trace.HitPos.Y,trace.HitVector.X * -10.0,
                          trace.HitVector.Y * -10.0);
      bleedpos.X = ofs.X;
      bleedpos.Y = ofs.Y;
      bleedpos.Z = trace.HitVector.Z * 10.0 + bleedpos.Z;
    }
    if (((flags & 8U) == 0) &&
       ((((pBVar4 == (BYTE *)0x0 || ((pBVar4[0x1c7] & 0x40) == 0)) &&
         ((((trace.Actor)->flags).Value & 0x80000) == 0)) &&
        ((((trace.Actor)->flags2).Value & 0x18000000) == 0)))) {
      pAVar15 = (AActor *)0x0;
LAB_004108b9:
      if ((pBVar4 != (BYTE *)0x0) && (0 < *(int *)(pBVar4 + 0x360))) {
        pAVar16 = pAVar15;
        if (pAVar15 == (AActor *)0x0) {
          pAVar16 = t1;
        }
        local_1a4.Index = *(int *)(pBVar4 + 0x364);
        P_PoisonMobj(trace.Actor,pAVar16,t1,*(int *)(pBVar4 + 0x360),*(int *)(pBVar4 + 0x368),
                     *(int *)(pBVar4 + 0x36c),&local_1a4);
      }
      if ((damage == 0) &&
         ((pBVar4 == (BYTE *)0x0 || (((pBVar4[0x1d0] & 8) == 0 && ((pBVar4[0x1d5] & 4) == 0)))))) {
        bVar11 = false;
        iVar12 = 0;
      }
      else {
        if ((!bVar19 && t1->player != (player_t *)0x0) &&
           (pAVar5 = t1->player->ReadyWeapon, pAVar5 != (AWeapon *)0x0)) {
          local_214 = local_214 |
                      (pAVar5->super_AStateProvider).super_AInventory.super_AActor.flags5.Value >>
                      0xb & 1;
        }
        bVar11 = pAVar15 == (AActor *)0x0;
        if (bVar11) {
          local_68.Degrees = 0.0;
          local_70.Degrees = 0.0;
          pAVar15 = P_SpawnPuff(t1,pufftype,&bleedpos,&local_68,&local_70,2,flags_01 | 5,
                                (AActor *)0x0);
        }
        pAVar16 = pAVar15;
        if (pAVar15 == (AActor *)0x0) {
          pAVar16 = t1;
        }
        local_1a8 = (FName)damageType->Index;
        local_78.Degrees = trace.SrcAngleFromTarget.Degrees;
        iVar12 = P_DamageMobj(trace.Actor,pAVar16,t1,damage,&local_1a8,local_214 | 0x200,&local_78);
        if (actualdamage != (int *)0x0) {
          *actualdamage = iVar12;
        }
      }
      if ((pBVar4 == (BYTE *)0x0) || ((pBVar4[0x1c7] & 8) == 0)) {
        bVar18 = 1;
        if (((t1->flags5).Value & 0x100) == 0) {
          if ((t1->player == (player_t *)0x0) ||
             (pAVar5 = t1->player->ReadyWeapon, pAVar5 == (AWeapon *)0x0)) {
            bVar18 = 0;
          }
          else {
            bVar18 = ((pAVar5->super_AStateProvider).super_AInventory.field_0x4fc & 8) >> 3;
          }
        }
        if ((t1->player == (player_t *)0x0) ||
           (pAVar5 = t1->player->ReadyWeapon, pAVar5 == (AWeapon *)0x0)) {
          bVar17 = 0;
        }
        else {
          bVar17 = ((pAVar5->super_AStateProvider).super_AInventory.field_0x4fc & 8) >> 3;
        }
        if (((bVar18 == 0 && bVar17 == 0) && ((((trace.Actor)->flags).Value & 0x80000) == 0)) &&
           ((((trace.Actor)->flags2).Value & 0x18000000) == 0)) {
          local_80.Degrees = trace.SrcAngleFromTarget.Degrees;
          damage_00 = damage;
          if (0 < iVar12) {
            damage_00 = iVar12;
          }
          P_SpawnBlood(&bleedpos,&local_80,damage_00,trace.Actor);
        }
        if (damage != 0) {
          if (((bVar18 != 0 || bVar17 != 0) && ((((trace.Actor)->flags).Value & 0x80000) == 0)) &&
             ((((trace.Actor)->flags2).Value & 0x18000000) == 0)) {
            if (bVar17 != 0) {
              local_88.Degrees = trace.SrcAngleFromTarget.Degrees;
              P_BloodSplatter2(&bleedpos,trace.Actor,&local_88);
            }
            uVar13 = FRandom::GenRand32(&pr_lineattack);
            if ((~uVar13 & 0xc0) != 0) {
              local_90.Degrees = trace.SrcAngleFromTarget.Degrees;
              P_BloodSplatter(&bleedpos,trace.Actor,&local_90);
            }
          }
          if (0 < iVar12) {
            damage = iVar12;
          }
          local_98.Degrees = trace.SrcAngleFromTarget.Degrees;
          local_a0 = (DAngle)pitch->Degrees;
          P_TraceBleed(damage,&trace.HitPos,trace.Actor,&local_98,&local_a0);
        }
      }
      bVar10 = true;
      if (victim != (FTranslatedLineTarget *)0x0) {
        victim->linetarget = trace.Actor;
        (victim->attackAngleFromSource).Degrees = trace.SrcAngleFromTarget.Degrees;
        if (trace.unlinked == true) {
          ofs.X = trace.SrcAngleFromTarget.Degrees;
        }
        else {
          AActor::AngleTo((AActor *)&ofs,t1,SUB81(trace.Actor,0));
        }
        (victim->angleFromSource).Degrees = ofs.X;
        victim->unlinked = trace.unlinked;
      }
    }
    else {
      flags_01 = (((trace.Actor)->flags).Value >> 0x10 & 8 | flags_01) ^ 8;
      local_58.Degrees = trace.SrcAngleFromTarget.Degrees;
      local_60.Degrees = trace.SrcAngleFromTarget.Degrees + -90.0;
      pAVar15 = P_SpawnPuff(t1,pufftype,&bleedpos,&local_58,&local_60,2,flags_01 | 1,trace.Actor);
      bVar11 = false;
      bVar10 = false;
      if ((flags & 8U) == 0) goto LAB_004108b9;
    }
    if (!bVar10) {
      return pAVar15;
    }
  }
  else {
    if ((trace.HitType == TRACE_HitWall && (flags & 8U) == 0) &&
       ((~bVar18 & (trace.Line)->special == 9) != 0)) {
      pAVar15 = (AActor *)0x0;
    }
    else {
      P_GetOffsetPosition(trace.HitPos.X,trace.HitPos.Y,trace.HitVector.X * -4.0,
                          trace.HitVector.Y * -4.0);
      bleedpos.Z = trace.HitVector.Z * -4.0 + trace.HitPos.Z;
      bleedpos.X = ofs.X;
      bleedpos.Y = ofs.Y;
      local_48.Degrees = trace.SrcAngleFromTarget.Degrees;
      local_50.Degrees = trace.SrcAngleFromTarget.Degrees + -90.0;
      pAVar15 = P_SpawnPuff(t1,pufftype,&bleedpos,&local_48,&local_50,0,flags_01,(AActor *)0x0);
      pAVar15->radius = 1.52587890625e-05;
      if ((flags & 8U) != 0) {
        return pAVar15;
      }
    }
    if ((trace.HitType == TRACE_HitWall) && ((trace.Line)->special != 9)) {
      bVar19 = true;
      if ((trace.Line)->portalindex < linePortals.Count) {
        bVar19 = (linePortals.Array[(trace.Line)->portalindex].mFlags & 1) == 0;
      }
      if ((((flags & 4U) != 0) || (!bVar19)) || ((*(uint *)(pBVar4 + 0x1d4) >> 0x12 & 1) != 0))
      goto LAB_00410b50;
      pAVar16 = t1;
      if ((t1->DecalGenerator == (FDecalBase *)0x0) &&
         (((t1->player == (player_t *)0x0 ||
           (pAVar5 = t1->player->ReadyWeapon, pAVar5 == (AWeapon *)0x0)) ||
          ((pAVar5->super_AStateProvider).super_AInventory.super_AActor.DecalGenerator ==
           (FDecalBase *)0x0)))) {
        if (pAVar15 != (AActor *)0x0) {
LAB_00410ff0:
          if (pAVar15->DecalGenerator != (FDecalBase *)0x0) {
            pAVar16 = pAVar15;
          }
        }
      }
      else if ((pAVar15 != (AActor *)0x0) && ((*(uint *)(pBVar4 + 0x1d4) & 0x80000) != 0))
      goto LAB_00410ff0;
      SpawnShootDecal(pAVar16,&trace);
      bVar11 = false;
    }
    else {
LAB_00410b50:
      bVar11 = false;
      if (((pAVar15 != (AActor *)0x0) && (bVar11 = false, trace.CrossedWater == (sector_t *)0x0)) &&
         ((bVar11 = false, trace.HitType == TRACE_HitFloor &&
          ((trace.Sector)->heightsec == (sector_t *)0x0)))) {
        bVar11 = false;
        P_HitWater(pAVar15,trace.Sector,&trace.HitPos,false,true,false);
      }
    }
  }
  if (trace.CrossedWater != (sector_t *)0x0 || trace.Crossed3DWater != (F3DFloor *)0x0) {
    if (pAVar15 == (AActor *)0x0) {
      local_a8.Degrees = 0.0;
      local_b0.Degrees = 0.0;
      pAVar15 = P_SpawnPuff(t1,pufftype,&trace.HitPos,&local_a8,&local_b0,2,flags_01 | 5,
                            (AActor *)0x0);
      bVar11 = true;
    }
    SpawnDeepSplash(t1,&trace,pAVar15);
  }
LAB_00410f8c:
  if (pAVar15 == (AActor *)0x0) {
    return (AActor *)0x0;
  }
  if (bVar11) {
    (*(pAVar15->super_DThinker).super_DObject._vptr_DObject[4])(pAVar15);
    return (AActor *)0x0;
  }
  return pAVar15;
}

Assistant:

AActor *P_LineAttack(AActor *t1, DAngle angle, double distance,
	DAngle pitch, int damage, FName damageType, PClassActor *pufftype, int flags, FTranslatedLineTarget*victim, int *actualdamage)
{
	bool nointeract = !!(flags & LAF_NOINTERACT);
	DVector3 direction;
	double shootz;
	FTraceResults trace;
	Origin TData;
	TData.Caller = t1;
	bool killPuff = false;
	AActor *puff = NULL;
	int pflag = 0;
	int puffFlags = (flags & LAF_ISMELEEATTACK) ? PF_MELEERANGE : 0;
	bool spawnSky = false;
	if (flags & LAF_NORANDOMPUFFZ)
		puffFlags |= PF_NORANDOMZ;

	if (victim != NULL)
	{
		memset(victim, 0, sizeof(*victim));
	}
	if (actualdamage != NULL)
	{
		*actualdamage = 0;
	}

	double pc = pitch.Cos();

	direction = { pc * angle.Cos(), pc * angle.Sin(), -pitch.Sin() };
	shootz = t1->Center() - t1->Floorclip;

	if (t1->player != NULL)
	{
		shootz += t1->player->mo->AttackZOffset * t1->player->crouchfactor;
		if (damageType == NAME_Melee || damageType == NAME_Hitscan)
		{
			// this is coming from a weapon attack function which needs to transfer information to the obituary code,
			// We need to preserve this info from the damage type because the actual damage type can get overridden by the puff
			pflag = DMG_PLAYERATTACK;
		}
	}
	else
	{
		shootz += 8;
	}

	// We need to check the defaults of the replacement here
	AActor *puffDefaults = GetDefaultByType(pufftype->GetReplacement());
	
	TData.hitGhosts = (t1->player != NULL &&
		t1->player->ReadyWeapon != NULL &&
		(t1->player->ReadyWeapon->flags2 & MF2_THRUGHOST)) ||
		(puffDefaults && (puffDefaults->flags2 & MF2_THRUGHOST));
	
	spawnSky = (puffDefaults && (puffDefaults->flags3 & MF3_SKYEXPLODE));
	TData.MThruSpecies = (puffDefaults && (puffDefaults->flags6 & MF6_MTHRUSPECIES));
	TData.PuffSpecies = NAME_None;

	// [MC] To prevent possible mod breakage, this flag is pretty much necessary.
	// Somewhere, someone is relying on these to spawn on actors and move through them.

	if ((puffDefaults->flags7 & MF7_ALLOWTHRUFLAGS))
	{
		TData.ThruSpecies = (puffDefaults && (puffDefaults->flags6 & MF6_THRUSPECIES));
		TData.ThruActors = (puffDefaults && (puffDefaults->flags2 & MF2_THRUACTORS));

		// [MC] Because this is a one-hit trace event, we need to spawn the puff, get the species
		// and destroy it. Assume there is no species unless tempuff isn't NULL. We cannot get
		// a proper species the same way as puffDefaults flags it appears...

		AActor *tempuff = NULL;
		if (pufftype != NULL)
			tempuff = Spawn(pufftype, t1->Pos(), ALLOW_REPLACE);
		if (tempuff != NULL)
		{
			TData.PuffSpecies = tempuff->GetSpecies();
			tempuff->Destroy();
		}
	}
	else
	{
		TData.ThruSpecies = false;
		TData.ThruActors = false;
	}
	// if the puff uses a non-standard damage type, this will override default, hitscan and melee damage type.
	// All other explicitly passed damage types (currenty only MDK) will be preserved.
	if ((damageType == NAME_None || damageType == NAME_Melee || damageType == NAME_Hitscan) &&
		puffDefaults != NULL && puffDefaults->DamageType != NAME_None)
	{
		damageType = puffDefaults->DamageType;
	}

	int tflags;
	if (nointeract || (puffDefaults && puffDefaults->flags6 & MF6_NOTRIGGER)) tflags = TRACE_NoSky;
	else tflags = TRACE_NoSky | TRACE_Impact;

	if (!Trace(t1->PosAtZ(shootz), t1->Sector, direction, distance, MF_SHOOTABLE, 
		ML_BLOCKEVERYTHING | ML_BLOCKHITSCAN, t1, trace, tflags, CheckForActor, &TData))
	{ // hit nothing
		if (!nointeract && puffDefaults && puffDefaults->ActiveSound)
		{ // Play miss sound
			S_Sound(t1, CHAN_WEAPON, puffDefaults->ActiveSound, 1, ATTN_NORM);
		}

		// [MC] LAF_NOINTERACT guarantees puff spawning and returns it directly to the calling function.
		// No damage caused, no sounds played, no blood splatters.

		if (nointeract || (puffDefaults && puffDefaults->flags3 & MF3_ALWAYSPUFF))
		{ // Spawn the puff anyway
			puff = P_SpawnPuff(t1, pufftype, trace.HitPos, trace.SrcAngleFromTarget, trace.SrcAngleFromTarget, 2, puffFlags);

			if (nointeract)
			{
				return puff;
			}
		}
		else
		{
			return nullptr;
		}
	}
	else
	{
		if (trace.HitType != TRACE_HitActor)
		{
			// position a bit closer for puffs
			if (nointeract || trace.HitType != TRACE_HitWall || ((trace.Line->special != Line_Horizon) || spawnSky))
			{
				DVector2 pos = P_GetOffsetPosition(trace.HitPos.X, trace.HitPos.Y, -trace.HitVector.X * 4, -trace.HitVector.Y * 4);
				puff = P_SpawnPuff(t1, pufftype, DVector3(pos, trace.HitPos.Z - trace.HitVector.Z * 4), trace.SrcAngleFromTarget,
					trace.SrcAngleFromTarget - 90, 0, puffFlags);
				puff->radius = 1/65536.;

				if (nointeract)
				{
					return puff;
				}
			}

			// [RH] Spawn a decal
			if (trace.HitType == TRACE_HitWall && trace.Line->special != Line_Horizon && !trace.Line->isVisualPortal() && !(flags & LAF_NOIMPACTDECAL) && !(puffDefaults->flags7 & MF7_NODECAL))
			{
				// [TN] If the actor or weapon has a decal defined, use that one.
				if (t1->DecalGenerator != NULL ||
					(t1->player != NULL && t1->player->ReadyWeapon != NULL && t1->player->ReadyWeapon->DecalGenerator != NULL))
				{
					// [ZK] If puff has FORCEDECAL set, do not use the weapon's decal
					if (puffDefaults->flags7 & MF7_FORCEDECAL && puff != NULL && puff->DecalGenerator)
						SpawnShootDecal(puff, trace);
					else
						SpawnShootDecal(t1, trace);
				}

				// Else, look if the bulletpuff has a decal defined.
				else if (puff != NULL && puff->DecalGenerator)
				{
					SpawnShootDecal(puff, trace);
				}

				else
				{
					SpawnShootDecal(t1, trace);
				}
			}
			else if (puff != NULL &&
				trace.CrossedWater == NULL &&
				trace.Sector->heightsec == NULL &&
				trace.HitType == TRACE_HitFloor)
			{
				P_HitWater(puff, trace.Sector, trace.HitPos);
			}
		}
		else
		{
			// Hit a thing, so it could be either a puff or blood
			DVector3 bleedpos = trace.HitPos;
			// position a bit closer for puffs/blood if using compatibility mode.
			if (i_compatflags & COMPATF_HITSCAN)
			{
				DVector2 ofs = P_GetOffsetPosition(bleedpos.X, bleedpos.Y, -10 * trace.HitVector.X, -10 * trace.HitVector.Y);
				bleedpos.X = ofs.X;
				bleedpos.Y = ofs.Y;
				bleedpos.Z -= -10 * trace.HitVector.Z;
			}

			// Spawn bullet puffs or blood spots, depending on target type.
			if (nointeract || (puffDefaults && puffDefaults->flags3 & MF3_PUFFONACTORS) ||
				(trace.Actor->flags & MF_NOBLOOD) ||
				(trace.Actor->flags2 & (MF2_INVULNERABLE | MF2_DORMANT)))
			{
				if (!(trace.Actor->flags & MF_NOBLOOD))
					puffFlags |= PF_HITTHINGBLEED;

				// We must pass the unreplaced puff type here 
				puff = P_SpawnPuff(t1, pufftype, bleedpos, trace.SrcAngleFromTarget, trace.SrcAngleFromTarget - 90, 2, puffFlags | PF_HITTHING, trace.Actor);

				if (nointeract)
				{
					return puff;
				}
			}

			// Allow puffs to inflict poison damage, so that hitscans can poison, too.
			if (puffDefaults != NULL && puffDefaults->PoisonDamage > 0 && puffDefaults->PoisonDuration != INT_MIN)
			{
				P_PoisonMobj(trace.Actor, puff ? puff : t1, t1, puffDefaults->PoisonDamage, puffDefaults->PoisonDuration, puffDefaults->PoisonPeriod, puffDefaults->PoisonDamageType);
			}

			// [GZ] If MF6_FORCEPAIN is set, we need to call P_DamageMobj even if damage is 0!
			// Note: The puff may not yet be spawned here so we must check the class defaults, not the actor.
			int newdam = damage;
			if (damage || (puffDefaults != NULL && ((puffDefaults->flags6 & MF6_FORCEPAIN) || (puffDefaults->flags7 & MF7_CAUSEPAIN))))
			{
				int dmgflags = DMG_INFLICTOR_IS_PUFF | pflag;
				// Allow MF5_PIERCEARMOR on a weapon as well.
				if (t1->player != NULL && (dmgflags & DMG_PLAYERATTACK) && t1->player->ReadyWeapon != NULL &&
					t1->player->ReadyWeapon->flags5 & MF5_PIERCEARMOR)
				{
					dmgflags |= DMG_NO_ARMOR;
				}
				
				if (puff == NULL)
				{
					// Since the puff is the damage inflictor we need it here 
					// regardless of whether it is displayed or not.
					puff = P_SpawnPuff(t1, pufftype, bleedpos, 0., 0., 2, puffFlags | PF_HITTHING | PF_TEMPORARY);
					killPuff = true;
				}
				newdam = P_DamageMobj(trace.Actor, puff ? puff : t1, t1, damage, damageType, dmgflags|DMG_USEANGLE, trace.SrcAngleFromTarget);
				if (actualdamage != NULL)
				{
					*actualdamage = newdam;
				}
			}
			if (!(puffDefaults != NULL && puffDefaults->flags3&MF3_BLOODLESSIMPACT))
			{
				bool bloodsplatter = (t1->flags5 & MF5_BLOODSPLATTER) ||
					(t1->player != nullptr &&	t1->player->ReadyWeapon != nullptr &&
						(t1->player->ReadyWeapon->WeaponFlags & WIF_AXEBLOOD));

				bool axeBlood = (t1->player != nullptr &&
					t1->player->ReadyWeapon != nullptr &&
					(t1->player->ReadyWeapon->WeaponFlags & WIF_AXEBLOOD));

				if (!bloodsplatter && !axeBlood &&
					!(trace.Actor->flags & MF_NOBLOOD) &&
					!(trace.Actor->flags2 & (MF2_INVULNERABLE | MF2_DORMANT)))
				{
					P_SpawnBlood(bleedpos, trace.SrcAngleFromTarget, newdam > 0 ? newdam : damage, trace.Actor);
				}

				if (damage)
				{
					if (bloodsplatter || axeBlood)
					{
						if (!(trace.Actor->flags&MF_NOBLOOD) &&
							!(trace.Actor->flags2&(MF2_INVULNERABLE | MF2_DORMANT)))
						{
							if (axeBlood)
							{
								P_BloodSplatter2(bleedpos, trace.Actor, trace.SrcAngleFromTarget);
							}
							if (pr_lineattack() < 192)
							{
								P_BloodSplatter(bleedpos, trace.Actor, trace.SrcAngleFromTarget);
							}
						}
					}
					// [RH] Stick blood to walls
					P_TraceBleed(newdam > 0 ? newdam : damage, trace.HitPos, trace.Actor, trace.SrcAngleFromTarget, pitch);
				}
			}
			if (victim != NULL)
			{
				victim->linetarget = trace.Actor;
				victim->attackAngleFromSource = trace.SrcAngleFromTarget;
				// With arbitrary portals this cannot be calculated so using the actual attack angle is the only option.
				victim->angleFromSource = trace.unlinked? victim->attackAngleFromSource : t1->AngleTo(trace.Actor);
				victim->unlinked = trace.unlinked;
			}
		}
		if (trace.Crossed3DWater || trace.CrossedWater)
		{
			if (puff == NULL)
			{ // Spawn puff just to get a mass for the splash
				puff = P_SpawnPuff(t1, pufftype, trace.HitPos, 0., 0., 2, puffFlags | PF_HITTHING | PF_TEMPORARY);
				killPuff = true;
			}
			SpawnDeepSplash(t1, trace, puff);
		}
	}
	if (killPuff && puff != NULL)
	{
		puff->Destroy();
		puff = NULL;
	}
	return puff;
}